

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O2

string * __thiscall
chaiscript::json_wrap::to_json_abi_cxx11_
          (string *__return_storage_ptr__,json_wrap *this,Boxed_Value *t_bv)

{
  allocator<char> local_51;
  string local_50;
  _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  local_30;
  
  to_json_object((JSON *)&local_30,(Boxed_Value *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"  ",&local_51);
  json::JSON::dump(__return_storage_ptr__,(JSON *)&local_30,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__detail::__variant::
  _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  ::~_Variant_storage(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_json(const Boxed_Value &t_bv) { return to_json_object(t_bv).dump(); }